

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_time.c
# Opt level: O1

int pt_tcal_update_ovf(pt_time_cal *tcal,pt_config *config)

{
  int iVar1;
  
  iVar1 = -1;
  if (config != (pt_config *)0x0 && tcal != (pt_time_cal *)0x0) {
    *(undefined8 *)((long)&tcal->cyc_tsc + 4) = 0;
    *(undefined8 *)((long)&tcal->cyc_mtc + 4) = 0;
    tcal->tsc = 0;
    tcal->cyc_tsc = 0;
    tcal->field_0x38 = tcal->field_0x38 & 0xfe;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int pt_tcal_update_ovf(struct pt_time_cal *tcal,
		       const struct pt_config *config)
{
	if (!tcal || !config)
		return -pte_internal;

	tcal->tsc = 0ull;
	tcal->cyc_tsc = 0ull;
	tcal->cyc_mtc = 0ull;
	tcal->ctc = 0;
	tcal->have_mtc = 0;

	return 0;
}